

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O2

void handle_ieee_exc(CPUS390XState_conflict *env,uint8_t vxc,uint8_t vec_exc,uintptr_t retaddr)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,vxc) == 0) {
    if (vec_exc != '\0') {
      env->fpc = env->fpc | (uint)vec_exc << 0x10;
    }
    return;
  }
  tcg_s390_vector_exception(env,(uint)vxc,retaddr);
}

Assistant:

static void handle_ieee_exc(CPUS390XState *env, uint8_t vxc, uint8_t vec_exc,
                            uintptr_t retaddr)
{
    if (vxc) {
        /* on traps, the fpc flags are not updated, instruction is suppressed */
        tcg_s390_vector_exception(env, vxc, retaddr);
    }
    if (vec_exc) {
        /* indicate exceptions for all elements combined */
        env->fpc |= vec_exc << 16;
    }
}